

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

bool cmsys::SystemTools::MakeDirectory(string *path,mode_t *mode)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  string topdir;
  string dir;
  string local_100;
  long *local_e0 [2];
  long local_d0 [2];
  undefined1 local_c0 [144];
  
  if ((path->_M_string_length != 0) &&
     (iVar3 = lstat((path->_M_dataplus)._M_p,(stat *)local_c0), iVar3 == 0)) {
    bVar2 = FileIsDirectory(path);
    return bVar2;
  }
  if (path->_M_string_length == 0) {
    return false;
  }
  local_c0._0_8_ = local_c0 + 0x10;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c0,pcVar1,pcVar1 + path->_M_string_length);
  ConvertToUnixSlashes((string *)local_c0);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  lVar4 = std::__cxx11::string::find((char)local_c0,0x2f);
  if (lVar4 != -1) {
    do {
      std::__cxx11::string::substr((ulong)local_e0,(ulong)local_c0);
      std::__cxx11::string::operator=((string *)&local_100,(string *)local_e0);
      if (local_e0[0] != local_d0) {
        operator_delete(local_e0[0],local_d0[0] + 1);
      }
      iVar3 = mkdir(local_100._M_dataplus._M_p,0x1ff);
      if ((mode != (mode_t *)0x0) && (iVar3 == 0)) {
        SetPermissions(&local_100,*mode,false);
      }
      lVar4 = std::__cxx11::string::find((char)local_c0,0x2f);
    } while (lVar4 != -1);
  }
  std::__cxx11::string::_M_assign((string *)&local_100);
  iVar3 = mkdir(local_100._M_dataplus._M_p,0x1ff);
  if (iVar3 == 0) {
    if (mode != (mode_t *)0x0) {
      SetPermissions(&local_100,*mode,false);
    }
  }
  else {
    piVar5 = __errno_location();
    if (*piVar5 != 0x11) {
      bVar2 = false;
      goto LAB_0038b68a;
    }
  }
  bVar2 = true;
LAB_0038b68a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,
                    CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                             local_100.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  return bVar2;
}

Assistant:

bool SystemTools::MakeDirectory(const std::string& path, const mode_t* mode)
{
  if (SystemTools::PathExists(path)) {
    return SystemTools::FileIsDirectory(path);
  }
  if (path.empty()) {
    return false;
  }
  std::string dir = path;
  SystemTools::ConvertToUnixSlashes(dir);

  std::string::size_type pos = 0;
  std::string topdir;
  while ((pos = dir.find('/', pos)) != std::string::npos) {
    topdir = dir.substr(0, pos);

    if (Mkdir(topdir) == 0 && mode != KWSYS_NULLPTR) {
      SystemTools::SetPermissions(topdir, *mode);
    }

    ++pos;
  }
  topdir = dir;
  if (Mkdir(topdir) != 0) {
    // There is a bug in the Borland Run time library which makes MKDIR
    // return EACCES when it should return EEXISTS
    // if it is some other error besides directory exists
    // then return false
    if ((errno != EEXIST)
#ifdef __BORLANDC__
        && (errno != EACCES)
#endif
    ) {
      return false;
    }
  } else if (mode != KWSYS_NULLPTR) {
    SystemTools::SetPermissions(topdir, *mode);
  }

  return true;
}